

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O0

void TestFastDtoaGayShortestSingle(void)

{
  Vector<char> buffer_00;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  PrecomputedShortestSingle *v_00;
  PrecomputedShortestSingle *pPVar4;
  int iVar5;
  Vector<const_double_conversion::PrecomputedShortestSingle> VVar6;
  float v;
  PrecomputedShortestSingle current_test;
  int i;
  Vector<const_double_conversion::PrecomputedShortestSingle> precomputed;
  bool needed_max_length;
  int total;
  int succeeded;
  int point;
  int length;
  bool status;
  Vector<char> buffer;
  char buffer_container [100];
  int *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  int line;
  char *in_stack_ffffffffffffff20;
  char *file;
  int *decimal_point;
  int in_stack_ffffffffffffff48;
  FastDtoaMode FVar7;
  FastDtoaMode mode;
  undefined4 in_stack_ffffffffffffff5c;
  PrecomputedShortestSingle *pPVar8;
  undefined1 local_78 [16];
  char local_68 [104];
  
  double_conversion::Vector<char>::Vector((Vector<char> *)local_78,local_68,100);
  VVar6 = double_conversion::PrecomputedShortestSingleRepresentations();
  v_00 = VVar6.start_;
  iVar5 = VVar6.length_;
  FVar7 = FAST_DTOA_SHORTEST;
  pPVar8 = v_00;
  while( true ) {
    line = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    mode = FVar7;
    iVar3 = double_conversion::Vector<const_double_conversion::PrecomputedShortestSingle>::length
                      ((Vector<const_double_conversion::PrecomputedShortestSingle> *)
                       &stack0xffffffffffffff60);
    if (iVar3 <= (int)FVar7) break;
    pPVar4 = double_conversion::Vector<const_double_conversion::PrecomputedShortestSingle>::
             operator[]((Vector<const_double_conversion::PrecomputedShortestSingle> *)
                        &stack0xffffffffffffff60,mode);
    file = *(char **)pPVar4;
    decimal_point = (int *)pPVar4->representation;
    iVar3 = (int)file;
    buffer_00.start_._4_4_ = in_stack_ffffffffffffff5c;
    buffer_00.start_._0_4_ = iVar5;
    buffer_00._8_8_ = pPVar8;
    in_stack_ffffffffffffff18 = (char *)local_78._0_8_;
    in_stack_ffffffffffffff20 = (char *)local_78._8_8_;
    bVar2 = double_conversion::FastDtoa
                      ((double)v_00,mode,in_stack_ffffffffffffff48,buffer_00,
                       *(int **)&pPVar4->decimal_point,decimal_point);
    CheckHelper(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                (char *)CONCAT44(FVar7,in_stack_ffffffffffffff10),
                SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
    if (bVar2) {
      uVar1 = (ulong)in_stack_ffffffffffffff08 >> 0x20;
      in_stack_ffffffffffffff08 = decimal_point;
      CheckEqualsHelper(file,iVar3,in_stack_ffffffffffffff20,
                        (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                        (char *)CONCAT44(FVar7,in_stack_ffffffffffffff10),(int)uVar1);
      double_conversion::Vector<char>::start((Vector<char> *)local_78);
      CheckEqualsHelper(file,iVar3,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                        (char *)CONCAT44(FVar7,in_stack_ffffffffffffff10),
                        (char *)in_stack_ffffffffffffff08);
    }
    FVar7 = mode + FAST_DTOA_SHORTEST_SINGLE;
  }
  CheckHelper(in_stack_ffffffffffffff20,line,(char *)CONCAT44(FVar7,in_stack_ffffffffffffff10),
              SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
  CheckHelper(in_stack_ffffffffffffff20,line,(char *)CONCAT44(FVar7,in_stack_ffffffffffffff10),
              SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
  return;
}

Assistant:

TEST(FastDtoaGayShortestSingle) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool status;
  int length;
  int point;
  int succeeded = 0;
  int total = 0;
  bool needed_max_length = false;

  Vector<const PrecomputedShortestSingle> precomputed =
      PrecomputedShortestSingleRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedShortestSingle current_test = precomputed[i];
    total++;
    float v = current_test.v;
    status = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
    CHECK(kFastDtoaMaximalSingleLength >= length);
    if (!status) continue;
    if (length == kFastDtoaMaximalSingleLength) needed_max_length = true;
    succeeded++;
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_EQ(current_test.representation, buffer.start());
  }
  CHECK(succeeded*1.0/total > 0.98);
  CHECK(needed_max_length);
}